

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O3

string_view translateCharacter(string_view object)

{
  int iVar1;
  size_type sVar2;
  int *__s1;
  int *in_RSI;
  char *__s2;
  size_t in_RDI;
  size_type __rlen_10;
  size_t __n;
  size_type __rlen;
  size_t sVar3;
  char *pcVar4;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  local_38._M_len = in_RDI;
  local_38._M_str = (char *)in_RSI;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_38,"GDI_",0,4);
  if (sVar2 == 0) {
    __s1 = (int *)((long)local_38._M_str + 4);
    __n = local_38._M_len - 4;
    if (__n == 7) {
      sVar3 = 7;
      if (*(int *)((long)local_38._M_str + 7) == 0x65796564 && *__s1 == 0x64616544) {
        pcVar4 = "Deadeye";
        goto LAB_00120ea9;
      }
      if (*(int *)((long)local_38._M_str + 7) == 0x65726977 && *__s1 == 0x77746f48) {
        pcVar4 = "Hotwire";
        goto LAB_00120ea9;
      }
      sVar3 = 0xb;
      if (*(int *)((long)local_38._M_str + 7) == 0x72656369 && *__s1 == 0x6966664f) {
        pcVar4 = "GDI Officer";
        goto LAB_00120ea9;
      }
      __n = 7;
      if (*(int *)((long)local_38._M_str + 7) == 0x72656964 && *__s1 == 0x646c6f53) {
        pcVar4 = "GDI Soldier";
        goto LAB_00120ea9;
      }
      goto switchD_00120fbc_caseD_b;
    }
    local_38._M_str = (char *)__s1;
    switch(local_38._M_len) {
    case 9:
      pcVar4 = "Havoc";
      local_38._M_len = __n;
      iVar1 = bcmp(__s1,"Havoc",__n);
      if (iVar1 == 0) {
        sVar3 = 5;
        goto LAB_00120ea9;
      }
      pcVar4 = "Patch";
      iVar1 = bcmp(__s1,"Patch",__n);
      __n = 5;
      sVar3 = 5;
      goto LAB_00121345;
    case 10:
      pcVar4 = "Gunner";
      local_38._M_len = __n;
      iVar1 = bcmp(__s1,"Gunner",__n);
      sVar3 = 6;
      if (iVar1 == 0) goto LAB_00120ea9;
      pcVar4 = "Mobius";
      iVar1 = bcmp(__s1,"Mobius",__n);
      if (iVar1 == 0) goto LAB_00120ea9;
      pcVar4 = "Sydney";
      __s2 = "Sydney";
      goto LAB_001210ed;
    case 0xc:
      local_38._M_len = __n;
      iVar1 = bcmp(__s1,"Engineer",__n);
      sVar3 = 0xc;
      if (iVar1 == 0) {
        pcVar4 = "GDI Engineer";
        goto LAB_00120ea9;
      }
      iVar1 = bcmp(__s1,"Marksman",__n);
      __n = 8;
      if (iVar1 == 0) {
        pcVar4 = "GDI Marksman";
        goto LAB_00120ea9;
      }
      break;
    case 0xd:
      pcVar4 = "Grenadier";
      local_38._M_len = __n;
      iVar1 = bcmp(__s1,"Grenadier",__n);
      if (iVar1 == 0) {
        sVar3 = 9;
        goto LAB_00120ea9;
      }
      pcVar4 = "McFarland";
      iVar1 = bcmp(__s1,"McFarland",__n);
      __n = 9;
      sVar3 = 9;
      goto LAB_00121345;
    case 0xe:
      local_38._M_len = __n;
      iVar1 = bcmp(__s1,"Shotgunner",__n);
      __n = 10;
      if (iVar1 == 0) {
        pcVar4 = "GDI Shotgunner";
        goto LAB_001213e2;
      }
      break;
    case 0x11:
      local_38._M_len = __n;
      iVar1 = bcmp(__s1,"RocketSoldier",__n);
      __n = 0xd;
      if (iVar1 == 0) {
        pcVar4 = "GDI Rocket Soldier";
        goto LAB_001211a1;
      }
    }
    goto switchD_00120fbc_caseD_b;
  }
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_38,"Nod_",0,4);
  __s1 = (int *)local_38._M_str;
  __n = local_38._M_len;
  if (sVar2 != 0) goto switchD_00120fbc_caseD_b;
  __s1 = (int *)((long)local_38._M_str + 4);
  __n = local_38._M_len - 4;
  local_38._M_str = (char *)__s1;
  switch(local_38._M_len) {
  case 10:
    pcVar4 = "Sakura";
    __s2 = "Sakura";
    local_38._M_len = __n;
LAB_001210ed:
    iVar1 = bcmp(__s1,__s2,__n);
    __n = 6;
    sVar3 = 6;
    goto LAB_00121345;
  case 0xb:
    pcVar4 = "Mendoza";
    local_38._M_len = __n;
    iVar1 = bcmp(__s1,"Mendoza",__n);
    if (iVar1 == 0) {
      sVar3 = 7;
      goto LAB_00120ea9;
    }
    iVar1 = bcmp(__s1,"Officer",__n);
    sVar3 = 0xb;
    if (iVar1 == 0) {
      pcVar4 = "Nod Officer";
      goto LAB_00120ea9;
    }
    iVar1 = bcmp(__s1,"Soldier",__n);
    __n = 7;
    if (iVar1 == 0) {
      pcVar4 = "Nod Soldier";
      goto LAB_00120ea9;
    }
    break;
  case 0xc:
    local_38._M_len = __n;
    iVar1 = bcmp(__s1,"Engineer",__n);
    sVar3 = 0xc;
    if (iVar1 == 0) {
      pcVar4 = "Nod Engineer";
      goto LAB_00120ea9;
    }
    iVar1 = bcmp(__s1,"Marksman",__n);
    if (iVar1 == 0) {
      pcVar4 = "Nod Marksman";
      goto LAB_00120ea9;
    }
    pcVar4 = "Raveshaw";
    iVar1 = bcmp(__s1,"Raveshaw",__n);
    __n = 8;
    sVar3 = 8;
    goto LAB_00121345;
  default:
    break;
  case 0xe:
    local_38._M_len = __n;
    iVar1 = bcmp(__s1,"Shotgunner",__n);
    if (iVar1 == 0) {
      pcVar4 = "Nod Shotgunner";
LAB_001213e2:
      sVar3 = 0xe;
      goto LAB_00120ea9;
    }
    pcVar4 = "Technician";
    iVar1 = bcmp(__s1,"Technician",__n);
    __n = 10;
    sVar3 = 10;
LAB_00121345:
    if (iVar1 == 0) goto LAB_00120ea9;
    break;
  case 0x10:
    local_38._M_len = __n;
    iVar1 = bcmp(__s1,"FlameTrooper",__n);
    __n = 0xc;
    if (iVar1 == 0) {
      pcVar4 = "Flame Trooper";
      sVar3 = 0xd;
      goto LAB_00120ea9;
    }
    break;
  case 0x11:
    local_38._M_len = __n;
    iVar1 = bcmp(__s1,"RocketSoldier",__n);
    __n = 0xd;
    if (iVar1 == 0) {
      pcVar4 = "Nod Rocket Soldier";
LAB_001211a1:
      sVar3 = 0x12;
      goto LAB_00120ea9;
    }
    break;
  case 0x13:
    local_38._M_len = __n;
    iVar1 = bcmp(__s1,"BlackHandSniper",__n);
    if (iVar1 == 0) {
      pcVar4 = "Black Hand Sniper";
      sVar3 = 0x11;
      goto LAB_00120ea9;
    }
    iVar1 = bcmp(__s1,"ChemicalTrooper",__n);
    __n = 0xf;
    if (iVar1 == 0) {
      pcVar4 = "Chemical Trooper";
      sVar3 = 0x10;
      goto LAB_00120ea9;
    }
    break;
  case 0x14:
    local_38._M_len = __n;
    iVar1 = bcmp(__s1,"LaserChainGunner",__n);
    sVar3 = 0x12;
    if (iVar1 == 0) {
      pcVar4 = "Laser Chain Gunner";
      goto LAB_00120ea9;
    }
    iVar1 = bcmp(__s1,"StealthBlackHand",__n);
    __n = 0x10;
    if (iVar1 == 0) {
      pcVar4 = "Stealth Black Hand";
      goto LAB_00120ea9;
    }
  }
switchD_00120fbc_caseD_b:
  sVar3 = __n;
  pcVar4 = (char *)__s1;
LAB_00120ea9:
  sVar5._M_str = pcVar4;
  sVar5._M_len = sVar3;
  return sVar5;
}

Assistant:

std::string_view translateCharacter(std::string_view object)
{
	if (object.find("GDI_"sv) == 0)
	{
		object.remove_prefix(4);
		if (object == "Deadeye"sv) return translated_GDI_Deadeye;
		if (object == "Engineer"sv) return translated_GDI_Engineer;
		if (object == "Grenadier"sv) return translated_GDI_Grenadier;
		if (object == "Gunner"sv) return translated_GDI_Gunner;
		if (object == "Havoc"sv) return translated_GDI_Havoc;
		if (object == "Hotwire"sv) return translated_GDI_Hotwire;
		if (object == "Marksman"sv) return translated_GDI_Marksman;
		if (object == "McFarland"sv) return translated_GDI_McFarland;
		if (object == "Mobius"sv) return translated_GDI_Mobius;
		if (object == "Officer"sv) return translated_GDI_Officer;
		if (object == "Patch"sv) return translated_GDI_Patch;
		if (object == "RocketSoldier"sv) return translated_GDI_RocketSoldier;
		if (object == "Shotgunner"sv) return translated_GDI_Shotgunner;
		if (object == "Soldier"sv) return translated_GDI_Soldier;
		if (object == "Sydney"sv) return translated_GDI_Sydney;
	}
	else if (object.find("Nod_"sv) == 0)
	{
		object.remove_prefix(4);
		if (object == "BlackHandSniper"sv) return translated_Nod_BlackHandSniper;
		if (object == "ChemicalTrooper"sv) return translated_Nod_ChemicalTrooper;
		if (object == "Engineer"sv) return translated_Nod_Engineer;
		if (object == "FlameTrooper"sv) return translated_Nod_FlameTrooper;
		if (object == "LaserChainGunner"sv) return translated_Nod_LaserChainGunner;
		if (object == "Marksman"sv) return translated_Nod_Marksman;
		if (object == "Mendoza"sv) return translated_Nod_Mendoza;
		if (object == "Officer"sv) return translated_Nod_Officer;
		if (object == "Raveshaw"sv) return translated_Nod_Raveshaw;
		if (object == "RocketSoldier"sv) return translated_Nod_RocketSoldier;
		if (object == "Sakura"sv) return translated_Nod_Sakura;
		if (object == "Shotgunner"sv) return translated_Nod_Shotgunner;
		if (object == "Soldier"sv) return translated_Nod_Soldier;
		if (object == "StealthBlackHand"sv) return translated_Nod_StealthBlackHand;
		if (object == "Technician"sv) return translated_Nod_Technician;
	}

	return object;
}